

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O2

_Bool uo_json_encode_number_test(void)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  
  pcVar6 = uo_json_encode_int64(json,1);
  *pcVar6 = '\0';
  uVar1 = json._0_2_;
  pcVar6 = uo_json_encode_double(json,1.234);
  *pcVar6 = '\0';
  iVar2 = bcmp(json,"1.234",6);
  pcVar6 = uo_json_encode_double(json,1e-05);
  *pcVar6 = '\0';
  iVar3 = bcmp(json,"1e-05",6);
  if (iVar3 == 0) {
    bVar7 = true;
  }
  else {
    iVar3 = bcmp(json,"1e-005",7);
    bVar7 = iVar3 == 0;
  }
  pcVar6 = uo_json_encode_int64(json,-100000000000);
  *pcVar6 = '\0';
  iVar3 = bcmp(json,"-100000000000",0xe);
  pcVar6 = uo_json_encode_bool(json,true);
  *pcVar6 = '\0';
  iVar4 = bcmp(json,"true",5);
  pcVar6 = uo_json_encode_bool(json,false);
  *pcVar6 = '\0';
  iVar5 = bcmp(json,"false",6);
  return (_Bool)((iVar5 == 0 && (iVar4 == 0 && iVar3 == 0)) & iVar2 == 0 & bVar7 & uVar1 == 0x31);
}

Assistant:

bool uo_json_encode_number_test(void)
{
    bool passed = true;
    char *end;

    end = uo_json_encode(json, 1);
    *end = '\0';
    passed &= strcmp(json, "1") == 0;

    end = uo_json_encode(json, 1.234);
    *end = '\0';
    passed &= strcmp(json, "1.234") == 0;

    end = uo_json_encode(json, 0.00001);
    *end = '\0';
    passed &= (strcmp(json, "1e-05") == 0 || strcmp(json, "1e-005") == 0);

    end = uo_json_encode(json, -100000000000);
    *end = '\0';
    passed &= strcmp(json, "-100000000000") == 0;

    bool t = true;
    end = uo_json_encode(json, t);
    *end = '\0';
    passed &= strcmp(json, "true") == 0;

    bool f = false;
    end = uo_json_encode(json, f);
    *end = '\0';
    passed &= strcmp(json, "false") == 0;

    return passed;
}